

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool sense_stuff(effect_handler_context_t_conflict *context,_func__Bool_object_ptr *pred,
                 object_kind *unknown_kind)

{
  _Bool _Var1;
  int iVar2;
  loc grid;
  object *obj;
  int iVar3;
  int y;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  iVar2 = (player->grid).x;
  iVar4 = (player->grid).y;
  y = iVar4 - context->y;
  iVar4 = context->y + iVar4;
  iVar5 = iVar2 - context->x;
  iVar3 = 0;
  if (y < 1) {
    y = iVar3;
  }
  if (iVar5 < 1) {
    iVar5 = iVar3;
  }
  iVar6 = cave->height + -1;
  if (iVar4 < cave->height) {
    iVar6 = iVar4;
  }
  if (y <= iVar6) {
    iVar2 = context->x + iVar2;
    iVar4 = cave->width + -1;
    if (iVar2 < cave->width) {
      iVar4 = iVar2;
    }
    iVar3 = 0;
    do {
      iVar2 = iVar5;
      if (iVar5 <= iVar4) {
        do {
          grid = (loc)loc(iVar2,y);
          obj = square_object(cave,grid);
          if (iVar3 == 0) {
            for (; obj != (object *)0x0; obj = obj->next) {
              _Var1 = (*pred)(obj);
              if ((_Var1) &&
                 (((obj->known == (object *)0x0 || (obj->known->kind == unknown_kind)) ||
                  (_Var1 = ignore_item_ok(player,obj), !_Var1)))) {
                iVar3 = 1;
              }
              if (iVar3 != 0) break;
            }
          }
          square_sense_pile(cave,grid,pred);
          bVar7 = iVar2 != iVar4;
          iVar2 = iVar2 + 1;
        } while (bVar7);
      }
      bVar7 = y != iVar6;
      y = y + 1;
    } while (bVar7);
  }
  return SUB41(iVar3,0);
}

Assistant:

static bool sense_stuff(effect_handler_context_t *context,
		bool (*pred)(const struct object*),
		const struct object_kind *unknown_kind)
{
	int x, y;
	int x1, x2, y1, y2;

	bool have_stuff = false;

	/* Pick an area to sense */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the area */
	for (y = y1; y <= y2; y++) {
		for (x = x1; x <= x2; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(cave, grid);

			for (; !have_stuff && obj; obj = obj->next) {
				if ((*pred)(obj)
						&& (!obj->known
						|| obj->known->kind == unknown_kind
						|| !ignore_item_ok(player, obj))) {
					have_stuff = true;
				}
			}

			/*
			 * Become aware of the parts of the pile that match
			 * the predicate.  Forget remembered parts that match
			 * the predicate which are no longer there.
			 */
			square_sense_pile(cave, grid, pred);
		}
	}

	return have_stuff;
}